

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int traversetable(global_State *g,Table *h)

{
  char *pcVar1;
  Node *n_00;
  int iVar2;
  bool bVar3;
  bool local_51;
  TValue *local_50;
  TValue *local_48;
  Node *n;
  TValue *mode;
  int weakvalue;
  int weakkey;
  int i;
  Table *h_local;
  global_State *g_local;
  
  local_51 = false;
  bVar3 = false;
  if ((h->metatable != (Table *)0x0) && ((h->metatable->marked & 3) != 0)) {
    reallymarkobject(g,(GCObject *)h->metatable);
  }
  if (h->metatable == (Table *)0x0) {
    local_48 = (TValue *)0x0;
  }
  else {
    if ((h->metatable->flags & 8) == 0) {
      local_50 = luaT_gettm(h->metatable,TM_MODE,g->tmname[3]);
    }
    else {
      local_50 = (TValue *)0x0;
    }
    local_48 = local_50;
  }
  if ((local_48 != (TValue *)0x0) && (local_48->tt == 4)) {
    pcVar1 = strchr((char *)&(((local_48->value).gc)->h).array,0x6b);
    local_51 = pcVar1 != (char *)0x0;
    pcVar1 = strchr((char *)&(((local_48->value).gc)->h).array,0x76);
    bVar3 = pcVar1 != (char *)0x0;
    if ((local_51) || (bVar3)) {
      h->marked = h->marked & 0xe7;
      h->marked = h->marked | local_51 << 3 | bVar3 << 4;
      h->gclist = g->weak;
      g->weak = (GCObject *)h;
    }
  }
  if ((local_51) && (bVar3)) {
    g_local._4_4_ = 1;
  }
  else {
    if (!bVar3) {
      weakvalue = h->sizearray;
      while (iVar2 = weakvalue + -1, weakvalue != 0) {
        weakvalue = iVar2;
        if ((3 < h->array[iVar2].tt) && ((((h->array[iVar2].value.gc)->gch).marked & 3) != 0)) {
          reallymarkobject(g,h->array[iVar2].value.gc);
        }
      }
    }
    weakvalue = (int)(1L << (h->lsizenode & 0x3f));
    while (iVar2 = weakvalue + -1, weakvalue != 0) {
      n_00 = h->node + iVar2;
      weakvalue = iVar2;
      if ((n_00->i_val).tt == 0) {
        removeentry(n_00);
      }
      else {
        if (((!local_51) && (3 < (n_00->i_key).nk.tt)) &&
           (((((n_00->i_key).nk.value.gc)->gch).marked & 3) != 0)) {
          reallymarkobject(g,(n_00->i_key).nk.value.gc);
        }
        if (((!bVar3) && (3 < (n_00->i_val).tt)) &&
           (((((n_00->i_val).value.gc)->gch).marked & 3) != 0)) {
          reallymarkobject(g,(n_00->i_val).value.gc);
        }
      }
    }
    local_51 = local_51 || bVar3;
    g_local._4_4_ = (uint)local_51;
  }
  return g_local._4_4_;
}

Assistant:

static int traversetable(global_State*g,Table*h){
int i;
int weakkey=0;
int weakvalue=0;
const TValue*mode;
if(h->metatable)
markobject(g,h->metatable);
mode=gfasttm(g,h->metatable,TM_MODE);
if(mode&&ttisstring(mode)){
weakkey=(strchr(svalue(mode),'k')!=NULL);
weakvalue=(strchr(svalue(mode),'v')!=NULL);
if(weakkey||weakvalue){
h->marked&=~(bitmask(3)|bitmask(4));
h->marked|=cast_byte((weakkey<<3)|
(weakvalue<<4));
h->gclist=g->weak;
g->weak=obj2gco(h);
}
}
if(weakkey&&weakvalue)return 1;
if(!weakvalue){
i=h->sizearray;
while(i--)
markvalue(g,&h->array[i]);
}
i=sizenode(h);
while(i--){
Node*n=gnode(h,i);
if(ttisnil(gval(n)))
removeentry(n);
else{
if(!weakkey)markvalue(g,gkey(n));
if(!weakvalue)markvalue(g,gval(n));
}
}
return weakkey||weakvalue;
}